

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O0

bool __thiscall ser::Savepoint::operator<(Savepoint *this,Savepoint *other)

{
  bool bVar1;
  Savepoint *other_local;
  Savepoint *this_local;
  
  bVar1 = std::operator!=(&this->name_,&other->name_);
  if (bVar1) {
    this_local._7_1_ = std::operator<(&this->name_,&other->name_);
  }
  else {
    this_local._7_1_ = MetainfoSet::operator<(&this->metainfo_,&other->metainfo_);
  }
  return this_local._7_1_;
}

Assistant:

bool Savepoint::operator<(const Savepoint& other) const
{
    if (name_ != other.name_)
        return name_ < other.name_;

    return metainfo_ < other.metainfo_;
}